

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::(anonymous_namespace)::TeeBranch> __thiscall
kj::heap<kj::(anonymous_namespace)::TeeBranch,kj::Own<kj::(anonymous_namespace)::AsyncTee>,int>
          (kj *this,Own<kj::(anonymous_namespace)::AsyncTee> *params,int *params_1)

{
  TeeBranch *this_00;
  Own<kj::(anonymous_namespace)::AsyncTee> *other;
  int *piVar1;
  TeeBranch *extraout_RDX;
  Own<kj::(anonymous_namespace)::TeeBranch> OVar2;
  Own<kj::(anonymous_namespace)::AsyncTee> local_30;
  int *local_20;
  int *params_local_1;
  Own<kj::(anonymous_namespace)::AsyncTee> *params_local;
  
  local_20 = params_1;
  params_local_1 = (int *)params;
  params_local = (Own<kj::(anonymous_namespace)::AsyncTee> *)this;
  this_00 = (TeeBranch *)operator_new(0x20);
  other = fwd<kj::Own<kj::(anonymous_namespace)::AsyncTee>>
                    ((NoInfer<kj::Own<kj::(anonymous_namespace)::AsyncTee>_> *)params_local_1);
  Own<kj::(anonymous_namespace)::AsyncTee>::Own(&local_30,other);
  piVar1 = fwd<int>(local_20);
  anon_unknown_77::TeeBranch::TeeBranch(this_00,&local_30,(uint8_t)*piVar1);
  Own<kj::(anonymous_namespace)::TeeBranch>::Own
            ((Own<kj::(anonymous_namespace)::TeeBranch> *)this,this_00,
             (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::TeeBranch>::instance);
  Own<kj::(anonymous_namespace)::AsyncTee>::~Own(&local_30);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}